

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_replacement_pass.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::ScalarReplacementPass::CheckAnnotations
          (ScalarReplacementPass *this,Instruction *varInst)

{
  Instruction *this_00;
  bool bVar1;
  uint32_t uVar2;
  Op OVar3;
  DecorationManager *this_01;
  reference ppIVar4;
  Decoration decoration;
  Instruction *inst;
  __normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
  local_50;
  iterator __end2;
  iterator __begin2;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *__range2;
  Instruction *varInst_local;
  ScalarReplacementPass *this_local;
  
  this_01 = Pass::get_decoration_mgr((Pass *)this);
  uVar2 = opt::Instruction::result_id(varInst);
  analysis::DecorationManager::GetDecorationsFor
            ((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *)
             &__begin2,this_01,uVar2,false);
  __end2 = std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
           ::begin((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                    *)&__begin2);
  local_50._M_current =
       (Instruction **)
       std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::end
                 ((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                   *)&__begin2);
  do {
    bVar1 = __gnu_cxx::operator!=(&__end2,&local_50);
    if (!bVar1) {
      inst._4_4_ = 2;
LAB_0082be21:
      std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
      ~vector((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *
              )&__begin2);
      if (inst._4_4_ != 1) {
        this_local._7_1_ = 1;
      }
      return (bool)(this_local._7_1_ & 1);
    }
    ppIVar4 = __gnu_cxx::
              __normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
              ::operator*(&__end2);
    this_00 = *ppIVar4;
    OVar3 = opt::Instruction::opcode(this_00);
    if (OVar3 != OpDecorate) {
      __assert_fail("inst->opcode() == spv::Op::OpDecorate",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/scalar_replacement_pass.cpp"
                    ,0x2c7,
                    "bool spvtools::opt::ScalarReplacementPass::CheckAnnotations(const Instruction *) const"
                   );
    }
    uVar2 = opt::Instruction::GetSingleWordInOperand(this_00,1);
    if (((1 < uVar2 - 0x12) && (2 < uVar2 - 0x2c)) && (uVar2 != 0x14eb && uVar2 != 0x14ec)) {
      this_local._7_1_ = 0;
      inst._4_4_ = 1;
      goto LAB_0082be21;
    }
    __gnu_cxx::
    __normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
    ::operator++(&__end2);
  } while( true );
}

Assistant:

bool ScalarReplacementPass::CheckAnnotations(const Instruction* varInst) const {
  for (auto inst :
       get_decoration_mgr()->GetDecorationsFor(varInst->result_id(), false)) {
    assert(inst->opcode() == spv::Op::OpDecorate);
    auto decoration = spv::Decoration(inst->GetSingleWordInOperand(1u));
    switch (decoration) {
      case spv::Decoration::Invariant:
      case spv::Decoration::Restrict:
      case spv::Decoration::Alignment:
      case spv::Decoration::AlignmentId:
      case spv::Decoration::MaxByteOffset:
      case spv::Decoration::AliasedPointer:
      case spv::Decoration::RestrictPointer:
        break;
      default:
        return false;
    }
  }

  return true;
}